

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void timeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  char local_b8 [8];
  char zBuf [100];
  DateTime x;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  iVar1 = isDate(context,argc,argv,(DateTime *)(zBuf + 0x60));
  if (iVar1 == 0) {
    computeHMS((DateTime *)(zBuf + 0x60));
    sqlite3_snprintf(100,local_b8,"%02d:%02d:%02d",(ulong)(uint)x.M,(ulong)(uint)x.D,
                     (ulong)(uint)(int)(double)x._24_8_);
    sqlite3_result_text(context,local_b8,-1,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void timeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    char zBuf[100];
    computeHMS(&x);
    sqlite3_snprintf(sizeof(zBuf), zBuf, "%02d:%02d:%02d", x.h, x.m, (int)x.s);
    sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
  }
}